

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O1

state_status_t __thiscall
tchecker::zg::elapsed_semantics_t::initial
          (elapsed_semantics_t *this,db_t *dbm,clock_id_t dim,bool delay_allowed,
          clock_constraint_container_t *invariant)

{
  status_t sVar1;
  state_status_t sVar2;
  
  tchecker::dbm::zero(dbm,dim);
  sVar1 = tchecker::dbm::constrain(dbm,dim,invariant);
  sVar2 = 0x80;
  if (sVar1 != EMPTY) {
    if (delay_allowed) {
      tchecker::dbm::open_up(dbm,dim);
      sVar1 = tchecker::dbm::constrain(dbm,dim,invariant);
      if (sVar1 == EMPTY) {
        return 0x80;
      }
    }
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

tchecker::state_status_t elapsed_semantics_t::initial(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, bool delay_allowed,
                                                      tchecker::clock_constraint_container_t const & invariant)
{
  tchecker::dbm::zero(dbm, dim);

  if (tchecker::dbm::constrain(dbm, dim, invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  if (delay_allowed) {
    tchecker::dbm::open_up(dbm, dim);

    if (tchecker::dbm::constrain(dbm, dim, invariant) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;
  }

  return tchecker::STATE_OK;
}